

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

void act_var_rescale(sat_solver3 *s)

{
  int iVar1;
  word *pwVar2;
  ulong uVar3;
  xdbl xVar4;
  ulong uVar5;
  long lVar6;
  undefined8 in_RSI;
  
  iVar1 = s->VarActType;
  if (iVar1 == 2) {
    pwVar2 = s->activity;
    for (lVar6 = 0; lVar6 < s->size; lVar6 = lVar6 + 1) {
      xVar4 = Xdbl_Div(pwVar2[lVar6],(uint)in_RSI);
      pwVar2[lVar6] = xVar4;
    }
    xVar4 = Xdbl_Div(s->var_inc,(uint)in_RSI);
    s->var_inc = xVar4;
  }
  else if (iVar1 == 1) {
    pwVar2 = s->activity;
    iVar1 = s->size;
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      pwVar2[lVar6] = (word)((double)pwVar2[lVar6] * 1e-100);
    }
    s->var_inc = (word)((double)s->var_inc * 1e-100);
  }
  else {
    if (iVar1 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0x129,"void act_var_rescale(sat_solver3 *)");
    }
    pwVar2 = s->activity;
    iVar1 = s->size;
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      pwVar2[lVar6] = pwVar2[lVar6] >> 0x13;
    }
    uVar5 = s->var_inc >> 0x13;
    uVar3 = 0x10;
    if (0x10 < (int)uVar5) {
      uVar3 = uVar5;
    }
    s->var_inc = uVar3 & 0xffffffff;
  }
  return;
}

Assistant:

static inline void act_var_rescale(sat_solver* s)  
{
    if ( s->VarActType == 0 )
    {
        word* activity = s->activity;
        int i;
        for (i = 0; i < s->size; i++)
            activity[i] >>= 19;
        s->var_inc >>= 19;
        s->var_inc = Abc_MaxInt( (unsigned)s->var_inc, (1<<4) );
    }
    else if ( s->VarActType == 1 )
    {
        double* activity = (double*)s->activity;
        int i;
        for (i = 0; i < s->size; i++)
            activity[i] *= 1e-100;
        s->var_inc = Abc_Dbl2Word( Abc_Word2Dbl(s->var_inc) * 1e-100 );
        //printf( "Rescaling var activity...\n" ); 
    }
    else if ( s->VarActType == 2 )
    {
        xdbl * activity = s->activity;
        int i;
        for (i = 0; i < s->size; i++)
            activity[i] = Xdbl_Div( activity[i], 200 ); // activity[i] / 2^200
        s->var_inc = Xdbl_Div( s->var_inc, 200 ); 
    }
    else assert(0);
}